

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O3

sexp_conflict json_read_object(sexp_conflict ctx,sexp_conflict self,sexp_conflict in)

{
  sexp psVar1;
  sexp psVar2;
  sexp_uint_t sVar3;
  bool bVar4;
  uint uVar5;
  ushort **ppuVar6;
  sexp_conflict psVar7;
  char *msg;
  sexp_conflict ir;
  sexp_conflict tmp;
  sexp_conflict local_60;
  long local_58;
  long *local_50;
  sexp_gc_var_t *local_48;
  sexp_conflict *local_40;
  undefined8 local_38;
  
  local_40 = &local_60;
  local_60 = (sexp_conflict)0x43e;
  local_50 = &local_58;
  local_38 = &local_50;
  local_48 = (ctx->value).context.saves;
  psVar7 = (sexp_conflict)&local_40;
  (ctx->value).context.saves = (sexp_gc_var_t *)psVar7;
  local_58 = 0x23e;
LAB_001034d1:
  bVar4 = true;
LAB_001034d7:
  psVar1 = (in->value).type.setters;
  if (psVar1 == (sexp)0x0) {
    uVar5 = getc((FILE *)(in->value).type.getters);
  }
  else {
    psVar2 = (in->value).type.print;
    if (psVar2 < (sexp)(in->value).port.size) {
      (in->value).type.print = (sexp)((long)&psVar2->tag + 1);
      uVar5 = (uint)*(byte *)((long)&psVar2->tag + (long)&psVar1->tag);
    }
    else {
      psVar7 = in;
      uVar5 = sexp_buffered_read_char(ctx);
    }
  }
  if (uVar5 == 0x7d) {
    if (!(bool)(local_58 != 0x23e & bVar4)) {
      psVar7 = (sexp_conflict)sexp_nreverse_op(ctx,0,1);
      goto LAB_001036b2;
    }
    msg = "missing value after comma in json object";
    goto LAB_001036a1;
  }
  if (uVar5 == 0xffffffff) {
    msg = "unterminated object in json";
    goto LAB_001036a1;
  }
  if (uVar5 == 0x2c && bVar4) {
    msg = "unexpected comma in json object";
    goto LAB_001036a1;
  }
  if (uVar5 != 0x2c) goto code_r0x0010353b;
  goto LAB_001034d1;
code_r0x0010353b:
  ppuVar6 = __ctype_b_loc();
  if ((*(byte *)((long)*ppuVar6 + (long)(int)uVar5 * 2 + 1) & 0x20) != 0) goto LAB_001034d7;
  if (bVar4) {
    sVar3 = (in->value).bytecode.max_depth;
    if (sVar3 == 0) {
      ungetc(uVar5,(FILE *)(in->value).type.getters);
    }
    else {
      psVar1 = (in->value).type.print;
      (in->value).type.print = (sexp)((long)&psVar1[-1].value + 0x60bf);
      *(char *)((sVar3 - 1) + (long)psVar1) = (char)uVar5;
    }
    psVar7 = json_read(ctx,self,in);
    local_60 = psVar7;
    if (((ulong)psVar7 & 3) == 0) {
      if (psVar7->tag == 9) {
        local_60 = (sexp_conflict)sexp_string_to_symbol_op(ctx,0,1,psVar7);
      }
      else if (psVar7->tag == 0x13) goto LAB_001036b2;
    }
    psVar7 = (sexp_conflict)0x0;
    local_60 = (sexp_conflict)sexp_cons_op(ctx,0,2,local_60,0x43e);
    do {
      psVar1 = (in->value).type.setters;
      if (psVar1 == (sexp)0x0) {
        uVar5 = getc((FILE *)(in->value).type.getters);
      }
      else {
        psVar2 = (in->value).type.print;
        if (psVar2 < (sexp)(in->value).port.size) {
          (in->value).type.print = (sexp)((long)&psVar2->tag + 1);
          uVar5 = (uint)*(byte *)((long)&psVar2->tag + (long)&psVar1->tag);
        }
        else {
          psVar7 = in;
          uVar5 = sexp_buffered_read_char(ctx);
        }
      }
    } while ((*(byte *)((long)*ppuVar6 + (long)(int)uVar5 * 2 + 1) & 0x20) != 0);
    if (uVar5 == 0x3a) {
      psVar7 = json_read(ctx,self,in);
      (local_60->value).type.cpl = psVar7;
      if ((((ulong)psVar7 & 3) != 0) || (psVar7->tag != 0x13)) {
        bVar4 = false;
        psVar7 = (sexp_conflict)0x0;
        local_58 = sexp_cons_op(ctx,0,2,local_60,local_58);
        goto LAB_001034d7;
      }
      goto LAB_001036b2;
    }
    ir = (sexp_conflict)((long)(int)uVar5 << 8 | 0x1e);
    msg = "missing colon in json object";
  }
  else {
    msg = "unexpected value in json object";
LAB_001036a1:
    ir = (sexp_conflict)&DAT_0000023e;
  }
  psVar7 = sexp_json_read_exception(ctx,psVar7,msg,in,ir);
LAB_001036b2:
  (ctx->value).context.saves = local_48;
  return psVar7;
}

Assistant:

sexp json_read_object (sexp ctx, sexp self, sexp in) {
  sexp_gc_var2(res, tmp);
  sexp_gc_preserve2(ctx, res, tmp);
  int comma = 1, ch;
  res = SEXP_NULL;
  while (1) {
    ch = sexp_read_char(ctx, in);
    if (ch == EOF) {
      res = sexp_json_read_exception(ctx, self, "unterminated object in json", in, SEXP_NULL);
      break;
    } else if (ch == '}') {
      if (comma && res != SEXP_NULL) {
        res = sexp_json_read_exception(ctx, self, "missing value after comma in json object", in, SEXP_NULL);
      } else {
        res = sexp_nreverse(ctx, res);
      }
      break;
    } else if (ch == ',' && comma) {
      res = sexp_json_read_exception(ctx, self, "unexpected comma in json object", in, SEXP_NULL);
      break;
    } else if (ch == ',') {
      comma = 1;
    } else if (!isspace(ch)) {
      if (comma) {
        sexp_push_char(ctx, ch, in);
        tmp = json_read(ctx, self, in);
        if (sexp_exceptionp(tmp)) {
          res = tmp;
          break;
        } else if (sexp_stringp(tmp)) {
          tmp = sexp_string_to_symbol(ctx, tmp);
        }
        tmp = sexp_cons(ctx, tmp, SEXP_VOID);
        for (ch = sexp_read_char(ctx, in); isspace(ch); ch = sexp_read_char(ctx, in))
          ;
        if (ch != ':') {
          res = sexp_json_read_exception(ctx, self, "missing colon in json object", in, sexp_make_character(ch));
          break;
        }
        sexp_cdr(tmp) = json_read(ctx, self, in);
        if (sexp_exceptionp(sexp_cdr(tmp))) {
          res = sexp_cdr(tmp);
          break;
        }
        res = sexp_cons(ctx, tmp, res);
        comma = 0;
      } else {
        res = sexp_json_read_exception(ctx, self, "unexpected value in json object", in, SEXP_NULL);
        break;
      }
    }
  }
  sexp_gc_release2(ctx);
  return res;
}